

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O3

bool clip_encode_float_image(clip_ctx *ctx,int n_threads,float *img,int h,int w,float *vec)

{
  uint uVar1;
  ulong uVar2;
  clip_image_f32 clip_img;
  clip_image_f32 local_50;
  
  local_50.buf.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_50.buf.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_50.buf.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar1 = h * w * 3;
  std::vector<float,_std::allocator<float>_>::resize(&local_50.buf,(long)(int)uVar1);
  if (0 < (int)uVar1) {
    uVar2 = 0;
    do {
      local_50.buf.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_start[uVar2] = img[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  local_50.nx = w;
  local_50.ny = h;
  clip_image_encode(ctx,n_threads,&local_50,vec);
  if (local_50.buf.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_50.buf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.buf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.buf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool clip_encode_float_image (struct clip_ctx * ctx, int n_threads, float * img, int h, int w, float * vec) {
    clip_image_f32 clip_img;
    clip_img.buf.resize(h * w * 3);
    for (int i = 0; i < h*w*3; i++)
    {
        clip_img.buf[i] = img[i];
    }
    clip_img.nx = w;
    clip_img.ny = h;
    clip_image_encode(ctx, n_threads, &clip_img, vec);
    return true;
}